

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyeventhandle.cpp
# Opt level: O3

bool __thiscall KeyEventHandle::onHandleEvent(KeyEventHandle *this,Event *e)

{
  Handle *pHVar1;
  int iVar2;
  
  if (e == (Event *)0x0) {
    return false;
  }
  if (e->_type == TYPE_KEY) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[KEY] handling key event",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    return true;
  }
  pHVar1 = (this->super_EventHandle).super_Handle._successor;
  if (pHVar1 != (Handle *)0x0) {
    iVar2 = (*pHVar1->_vptr_Handle[2])();
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool KeyEventHandle::onHandleEvent(Event* e)
{
	if (!e)
		return false;

	switch (e->getType()) {
	case Event::TYPE_KEY:
		cout<<"[KEY] handling key event"<<endl;
		return true;
	default:
		break;
	}

	return EventHandle::onHandleEvent(e);
}